

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserKeyword.cpp
# Opt level: O2

bool __thiscall
Rml::PropertyParserKeyword::ParseValue
          (PropertyParserKeyword *this,Property *property,String *value,ParameterMap *parameters)

{
  NodePtr pDVar1;
  NodePtr pDVar2;
  const_iterator cVar3;
  Variant VStack_68;
  String local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,(string *)value);
  StringUtilities::ToLower((String *)&VStack_68,&local_40);
  cVar3 = robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(parameters,(key_type *)&VStack_68);
  pDVar2 = cVar3.mKeyVals;
  ::std::__cxx11::string::~string((string *)&VStack_68);
  ::std::__cxx11::string::~string((string *)&local_40);
  pDVar1 = (NodePtr)parameters->mInfo;
  if (pDVar2 != pDVar1) {
    Variant::Variant<int_const&,void>(&VStack_68,&(pDVar2->mData).second);
    Variant::operator=(&property->value,&VStack_68);
    Variant::~Variant(&VStack_68);
    property->unit = KEYWORD;
  }
  return pDVar2 != pDVar1;
}

Assistant:

bool PropertyParserKeyword::ParseValue(Property& property, const String& value, const ParameterMap& parameters) const
{
	ParameterMap::const_iterator iterator = parameters.find(StringUtilities::ToLower(value));
	if (iterator == parameters.end())
		return false;

	property.value = Variant((*iterator).second);
	property.unit = Unit::KEYWORD;

	return true;
}